

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall
QGraphicsWidget::paintWindowFrame
          (QGraphicsWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,QWidget *widget)

{
  QGraphicsWidgetPrivate *this_00;
  qreal qVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar9;
  QSize QVar10;
  QStyle *pQVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QSizeF QVar15;
  QPainterPath windowFrameBackground;
  QStyleHintReturnMask local_128;
  double local_118;
  double dStack_110;
  undefined8 local_108;
  int iStack_100;
  int iStack_fc;
  QStyleOptionFrame frameOptions;
  undefined1 local_a8 [8];
  qreal qStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = testAttribute(this,WA_OpaquePaintEvent);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    bVar3 = testAttribute(this,WA_NoSystemBackground);
    bVar3 = !bVar3;
  }
  this_01 = (QGraphicsProxyWidget *)
            QtPrivate::qobject_cast_helper<QGraphicsProxyWidget*,QObject>((QObject *)this);
  if (this_01 == (QGraphicsProxyWidget *)0x0) {
    bVar14 = false;
  }
  else {
    pQVar9 = QGraphicsProxyWidget::widget(this_01);
    bVar14 = pQVar9 != (QWidget *)0x0;
  }
  QVar15 = size(this);
  uStack_90 = (undefined1 *)QVar15.ht;
  local_a8 = (undefined1  [8])0x0;
  qStack_a0 = 0.0;
  local_98 = (undefined1 *)QVar15.wd;
  cVar4 = QRectF::contains((QRectF *)local_a8);
  if (cVar4 == '\0') {
    this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
    windowFrameGeometry((QRectF *)local_a8,this);
    frameOptions.super_QStyleOption._0_8_ = local_98;
    frameOptions.super_QStyleOption._8_8_ = uStack_90;
    QVar10 = QSizeF::toSize((QSizeF *)&frameOptions);
    iVar12 = QVar10.wd.m_i.m_i + -1;
    local_108 = 0.0;
    iVar13 = QVar10.ht.m_i.m_i + -1;
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    qStack_a0 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    iStack_100 = iVar12;
    iStack_fc = iVar13;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
    QStyleOption::operator=((QStyleOption *)local_a8,&option->super_QStyleOption);
    QGraphicsWidgetPrivate::initStyleOptionTitleBar(this_00,(QStyleOptionTitleBar *)local_a8);
    QGraphicsWidgetPrivate::ensureWindowData(this_00);
    uVar6 = (uint)(byte)((this_00->windowData)._M_t.
                         super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>.
                        _M_head_impl)->field_0x20;
    qStack_a0 = (qreal)CONCAT44(qStack_a0._4_4_,
                                ((uVar6 & 1) << 0xd | (uint)qStack_a0._0_4_ & 0xffffdffb) +
                                (uVar6 & 2) * 2);
    uStack_90 = (undefined1 *)CONCAT44(iStack_fc,iStack_100);
    local_98 = (undefined1 *)local_108;
    windowFrameRect((QRectF *)&frameOptions,this);
    local_118 = (double)frameOptions.super_QStyleOption._0_8_;
    dStack_110 = (double)frameOptions.super_QStyleOption._8_8_;
    QPainter::translate((QPointF *)painter);
    local_128.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
    local_128.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleHintReturnMask::QStyleHintReturnMask(&local_128);
    pQVar11 = style(this);
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xf0))
                      (pQVar11,0x37,(QStyleOptionTitleBar *)local_a8,widget,&local_128);
    if (iVar7 == 0) {
      bVar5 = 0;
    }
    else {
      bVar5 = QRegion::isEmpty();
      bVar5 = bVar5 ^ 1;
    }
    pQVar11 = style(this);
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x1a,local_a8,widget,0);
    pQVar11 = style(this);
    iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x2c,local_a8,widget);
    if (bVar5 != 0) {
      QPainter::save();
      QPainter::setClipRegion((QRegion *)painter,(int)&local_128 + 8);
    }
    if (bVar3) {
      if (bVar14) {
        _windowFrameBackground = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath(&windowFrameBackground);
        frameOptions.super_QStyleOption.version = 0;
        frameOptions.super_QStyleOption.type = 0;
        frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
        frameOptions.super_QStyleOption.direction = LeftToRight;
        frameOptions.super_QStyleOption.rect._8_8_ = (double)((long)iVar13 + 1);
        frameOptions.super_QStyleOption.rect._0_8_ = (double)((long)iVar12 + 1);
        QPainterPath::addRect((QRectF *)&windowFrameBackground);
        QVar15 = size(this);
        frameOptions.super_QStyleOption._0_8_ = (0.0 - local_118) + 0.5;
        frameOptions.super_QStyleOption._8_8_ = (0.0 - dStack_110) + 0.5;
        dVar2 = QVar15.ht + -0.5 + -0.5;
        frameOptions.super_QStyleOption.rect.x2.m_i = SUB84(dVar2,0);
        frameOptions.super_QStyleOption.rect._0_8_ = QVar15.wd + -0.5 + -0.5;
        frameOptions.super_QStyleOption.rect.y2.m_i = (int)((ulong)dVar2 >> 0x20);
        QPainterPath::addRect((QRectF *)&windowFrameBackground);
        palette((QGraphicsWidget *)&frameOptions);
        QPalette::window((QPalette *)&frameOptions);
        QPainter::fillPath((QPainterPath *)painter,(QBrush *)&windowFrameBackground);
        QPalette::~QPalette((QPalette *)&frameOptions);
        QPainterPath::~QPainterPath(&windowFrameBackground);
      }
      else {
        palette((QGraphicsWidget *)&frameOptions);
        QPalette::window((QPalette *)&frameOptions);
        QPainter::fillRect((QRect *)painter,(QBrush *)&local_108);
        QPalette::~QPalette((QPalette *)&frameOptions);
      }
    }
    qVar1 = QGraphicsWidgetPrivate::titleBarHeight(this_00,(QStyleOptionTitleBar *)local_a8);
    iVar12 = local_98._4_4_ + (int)qVar1;
    if (iVar7 == 0) {
      local_98 = (undefined1 *)CONCAT44(local_98._4_4_ + iVar8,local_98._0_4_ + iVar8);
      uStack_90._0_4_ = uStack_90._0_4_ - iVar8;
    }
    uStack_90 = (undefined1 *)CONCAT44(iVar12 + -1,uStack_90._0_4_);
    QPainter::save();
    QApplication::font((QApplication *)&frameOptions,"QMdiSubWindowTitleBar");
    QPainter::setFont((QFont *)painter);
    QFont::~QFont((QFont *)&frameOptions);
    pQVar11 = style(this);
    (**(code **)(*(long *)pQVar11 + 200))(pQVar11,5,local_a8,painter,widget);
    QPainter::restore();
    if (bVar5 != 0) {
      QPainter::restore();
    }
    frameOptions._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    frameOptions.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame(&frameOptions);
    QStyleOption::operator=(&frameOptions.super_QStyleOption,&option->super_QStyleOption);
    (**(code **)(*(long *)this + 0x98))(this,&frameOptions);
    if (iVar7 != 0) {
      _windowFrameBackground =
           (undefined1 *)CONCAT44((int)qVar1 + local_108._4_4_,(undefined4)local_108);
      QPainter::setClipRect((QRect *)painter,(ClipOperation)&windowFrameBackground);
    }
    bVar3 = QGraphicsItem::hasFocus((QGraphicsItem *)(this + 0x10));
    frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((uint)bVar3 << 8 |
         (uint)frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
               .super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffeff);
    bVar3 = QGraphicsItem::isActive((QGraphicsItem *)(this + 0x10));
    frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((uint)bVar3 << 0x10 |
         (uint)frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
               .super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffeffff);
    frameOptions.super_QStyleOption.palette._8_8_ =
         frameOptions.super_QStyleOption.palette._8_8_ & 0xffffffff00000000;
    frameOptions.super_QStyleOption.rect.y2.m_i = iStack_fc;
    frameOptions.super_QStyleOption.rect.x2.m_i = iStack_100;
    frameOptions.super_QStyleOption.rect._0_8_ = local_108;
    pQVar11 = style(this);
    frameOptions.lineWidth = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x2c,0,widget);
    frameOptions.midLineWidth = 1;
    pQVar11 = style(this);
    (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,9,&frameOptions,painter,widget);
    QStyleOption::~QStyleOption(&frameOptions.super_QStyleOption);
    QStyleHintReturnMask::~QStyleHintReturnMask(&local_128);
    QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
  }
  else if (!bVar14 && bVar3) {
    palette((QGraphicsWidget *)local_a8);
    QPalette::window((QPalette *)local_a8);
    QPainter::fillRect((QRectF *)painter,(QBrush *)&option->exposedRect);
    QPalette::~QPalette((QPalette *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::paintWindowFrame(QPainter *painter, const QStyleOptionGraphicsItem *option,
                                       QWidget *widget)
{
    const bool fillBackground = !testAttribute(Qt::WA_OpaquePaintEvent)
                                && !testAttribute(Qt::WA_NoSystemBackground);
    QGraphicsProxyWidget *proxy = qobject_cast<QGraphicsProxyWidget *>(this);
    const bool embeddedWidgetFillsOwnBackground = proxy && proxy->widget();

    if (rect().contains(option->exposedRect)) {
        if (fillBackground && !embeddedWidgetFillsOwnBackground)
            painter->fillRect(option->exposedRect, palette().window());
        return;
    }

    Q_D(QGraphicsWidget);

    QRect windowFrameRect = QRect(QPoint(), windowFrameGeometry().size().toSize());
    QStyleOptionTitleBar bar;
    bar.QStyleOption::operator=(*option);
    d->initStyleOptionTitleBar(&bar);   // this clear flags in bar.state
    d->ensureWindowData();
    bar.state.setFlag(QStyle::State_MouseOver, d->windowData->buttonMouseOver);
    bar.state.setFlag(QStyle::State_Sunken, d->windowData->buttonSunken);
    bar.rect = windowFrameRect;

    // translate painter to make the style happy
    const QPointF styleOrigin = this->windowFrameRect().topLeft();
    painter->translate(styleOrigin);

#ifdef Q_OS_MAC
    const QSize pixmapSize = windowFrameRect.size();
    if (pixmapSize.width() <= 0 || pixmapSize.height() <= 0)
        return;
    QPainter *realPainter = painter;
    QPixmap pm(pixmapSize);
    painter = new QPainter(&pm);
#endif

    // Fill background
    QStyleHintReturnMask mask;
    bool setMask = style()->styleHint(QStyle::SH_WindowFrame_Mask, &bar, widget, &mask) && !mask.region.isEmpty();
    bool hasBorder = !style()->styleHint(QStyle::SH_TitleBar_NoBorder, &bar, widget);
    int frameWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar, widget);
    if (setMask) {
        painter->save();
        painter->setClipRegion(mask.region, Qt::IntersectClip);
    }
    if (fillBackground) {
        if (embeddedWidgetFillsOwnBackground) {
            // Don't fill the background twice.
            QPainterPath windowFrameBackground;
            windowFrameBackground.addRect(windowFrameRect);
            // Adjust with 0.5 to avoid border artifacts between
            // widget background and frame background.
            windowFrameBackground.addRect(rect().translated(-styleOrigin).adjusted(0.5, 0.5, -0.5, -0.5));
            painter->fillPath(windowFrameBackground, palette().window());
        } else {
            painter->fillRect(windowFrameRect, palette().window());
        }
    }

    // Draw title
    int height = (int)d->titleBarHeight(bar);
    bar.rect.setHeight(height);
    if (hasBorder) // Frame is painted by PE_FrameWindow
        bar.rect.adjust(frameWidth, frameWidth, -frameWidth, 0);

    painter->save();
    painter->setFont(QApplication::font("QMdiSubWindowTitleBar"));
    style()->drawComplexControl(QStyle::CC_TitleBar, &bar, painter, widget);
    painter->restore();
    if (setMask)
        painter->restore();
    // Draw window frame
    QStyleOptionFrame frameOptions;
    frameOptions.QStyleOption::operator=(*option);
    initStyleOption(&frameOptions);
    if (!hasBorder)
        painter->setClipRect(windowFrameRect.adjusted(0, +height, 0, 0), Qt::IntersectClip);
    frameOptions.state.setFlag(QStyle::State_HasFocus, hasFocus());
    bool isActive = isActiveWindow();
    frameOptions.state.setFlag(QStyle::State_Active, isActive);

    frameOptions.palette.setCurrentColorGroup(isActive ? QPalette::Active : QPalette::Normal);
    frameOptions.rect = windowFrameRect;
    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, widget);
    frameOptions.midLineWidth = 1;
    style()->drawPrimitive(QStyle::PE_FrameWindow, &frameOptions, painter, widget);

#ifdef Q_OS_MAC
    realPainter->drawPixmap(QPoint(), pm);
    delete painter;
#endif
}